

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O3

uint64_t uv__hrtime(uv_clocktype_t type)

{
  int iVar1;
  uint64_t uVar2;
  clock_t cVar3;
  timespec t;
  timespec local_18;
  
  cVar3 = 1;
  if ((type == UV_CLOCK_FAST) &&
     (cVar3 = uv__hrtime::fast_clock_id, uv__hrtime::fast_clock_id == -1)) {
    iVar1 = clock_getres(6,&local_18);
    cVar3 = (ulong)(local_18.tv_nsec < 0xf4241 && iVar1 == 0) * 5 + 1;
    uv__hrtime::fast_clock_id = cVar3;
  }
  iVar1 = clock_gettime((clockid_t)cVar3,&local_18);
  if (iVar1 == 0) {
    uVar2 = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint64_t uv__hrtime(uv_clocktype_t type) {
  static clock_t fast_clock_id = -1;
  struct timespec t;
  clock_t clock_id;

  /* Prefer CLOCK_MONOTONIC_COARSE if available but only when it has
   * millisecond granularity or better.  CLOCK_MONOTONIC_COARSE is
   * serviced entirely from the vDSO, whereas CLOCK_MONOTONIC may
   * decide to make a costly system call.
   */
  /* TODO(bnoordhuis) Use CLOCK_MONOTONIC_COARSE for UV_CLOCK_PRECISE
   * when it has microsecond granularity or better (unlikely).
   */
  clock_id = CLOCK_MONOTONIC;
  if (type != UV_CLOCK_FAST)
    goto done;

  clock_id = uv__load_relaxed(&fast_clock_id);
  if (clock_id != -1)
    goto done;

  clock_id = CLOCK_MONOTONIC;
  if (0 == clock_getres(CLOCK_MONOTONIC_COARSE, &t))
    if (t.tv_nsec <= 1 * 1000 * 1000)
      clock_id = CLOCK_MONOTONIC_COARSE;

  uv__store_relaxed(&fast_clock_id, clock_id);

done:

  if (clock_gettime(clock_id, &t))
    return 0;  /* Not really possible. */

  return t.tv_sec * (uint64_t) 1e9 + t.tv_nsec;
}